

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O1

_Bool bp_wp_matches(ARMCPU_conflict1 *cpu,int n,_Bool is_wp)

{
  CPUWatchpoint *pCVar1;
  CPUBreakpoint *pCVar2;
  uint64_t uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint64_t unaff_R15;
  bool bVar9;
  bool bVar10;
  
  uVar6 = (cpu->env).features;
  if ((uVar6 >> 0x21 & 1) == 0) {
    bVar9 = false;
  }
  else {
    if ((cpu->env).aarch64 == 0) {
      bVar9 = ((cpu->env).uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar9 = (~(cpu->env).pstate & 0xc) == 0;
    }
    if (!bVar9) {
      bVar9 = ((cpu->env).cp15.scr_el3 & 1) == 0;
    }
  }
  if (((uint)uVar6 >> 9 & 1) == 0) {
    if ((cpu->env).aarch64 == 0) {
      uVar4 = (cpu->env).uncached_cpsr & 0x1f;
      if (uVar4 == 0x10) {
        uVar4 = 0;
      }
      else if (uVar4 == 0x16) {
        uVar4 = 3;
      }
      else if (uVar4 == 0x1a) {
        uVar4 = 2;
      }
      else {
        if ((uVar6 & 0x200000000) != 0) {
          bVar10 = uVar4 == 0x16;
          if (!bVar10) {
            bVar10 = ((cpu->env).cp15.scr_el3 & 1) == 0;
          }
          if ((((uint)uVar6 >> 0x1c & 1) == 0) && (uVar4 = 3, bVar10)) goto LAB_00611061;
        }
        uVar4 = 1;
      }
    }
    else {
      uVar4 = (cpu->env).pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((cpu->env).v7m.exception == 0) {
      uVar4 = ~(cpu->env).v7m.control[(cpu->env).v7m.secure] & 1;
    }
  }
LAB_00611061:
  if (is_wp) {
    pCVar1 = (cpu->env).cpu_watchpoint[n];
    bVar10 = false;
    if ((pCVar1 != (CPUWatchpoint *)0x0) && ((pCVar1->flags & 0xc0) != 0)) {
      unaff_R15 = (cpu->env).cp15.dbgwcr[n];
      uVar8 = 0;
      if (((uint)pCVar1->hitattrs & 4) == 0) {
        uVar8 = uVar4;
      }
LAB_006110ed:
      bVar10 = true;
      uVar4 = uVar8;
    }
  }
  else {
    if ((cpu->env).aarch64 == 0) {
      uVar6 = (ulong)(cpu->env).regs[0xf];
    }
    else {
      uVar6 = (cpu->env).pc;
    }
    pCVar2 = (cpu->env).cpu_breakpoint[n];
    if ((pCVar2 != (CPUBreakpoint *)0x0) && (pCVar2->pc == uVar6)) {
      unaff_R15 = (cpu->env).cp15.dbgbcr[n];
      uVar8 = uVar4;
      goto LAB_006110ed;
    }
    bVar10 = false;
  }
  if (!bVar10) {
    return false;
  }
  uVar8 = (uint)unaff_R15;
  switch((uint)(unaff_R15 >> 0xe) & 3) {
  case 0:
    break;
  default:
    if (bVar9) {
      return false;
    }
    break;
  case 2:
    if (!bVar9) {
      return false;
    }
  }
  if (uVar4 - 2 < 2) {
    if ((uVar8 >> 0xd & 1) == 0) {
      return false;
    }
  }
  else {
    if (uVar4 == 0) {
      uVar6 = unaff_R15 & 4;
    }
    else {
      uVar6 = unaff_R15 & 2;
    }
    if (uVar6 == 0) {
      return false;
    }
  }
  if ((uVar8 >> 0x14 & 1) == 0) {
    return true;
  }
  uVar8 = uVar8 >> 0x10 & 0xf;
  uVar4 = (uint)(cpu->env).features;
  if ((uVar4 >> 0x1c & 1) == 0) {
    uVar7 = (uint)*(byte *)((long)&(cpu->isar).dbgdidr + 3);
  }
  else {
    uVar7 = (uint)(cpu->isar).id_aa64dfr0 >> 0xc;
  }
  if ((uVar4 >> 0x1c & 1) == 0) {
    uVar4 = (cpu->isar).dbgdidr >> 0x14 & 0xf;
  }
  else {
    uVar4 = (uint)(cpu->isar).id_aa64dfr0 >> 0x1c;
  }
  if ((uVar7 & 0xf) < uVar8) {
    return false;
  }
  if ((int)uVar8 < (int)((uVar7 & 0xf) - uVar4)) {
    return false;
  }
  uVar6 = (cpu->env).cp15.dbgbcr[uVar8];
  if ((uVar6 & 1) == 0) {
    return false;
  }
  uVar4 = (uint)(uVar6 >> 0x14) & 0xf;
  uVar3 = arm_hcr_el2_eff_aarch64(&cpu->env);
  if (uVar4 == 0xd) {
    lVar5 = 0xa850;
    goto LAB_0061127c;
  }
  lVar5 = 0xa848;
  if (uVar4 == 7) goto LAB_0061127c;
  if (uVar4 != 3) {
    return false;
  }
  uVar6 = (cpu->env).features;
  uVar4 = (uint)uVar6;
  if ((uVar4 >> 9 & 1) == 0) {
    if ((cpu->env).aarch64 == 0) {
      uVar7 = (cpu->env).uncached_cpsr & 0x1f;
      if (uVar7 == 0x10) {
        uVar4 = 0;
      }
      else if (uVar7 == 0x16) {
        uVar4 = 3;
      }
      else if (uVar7 == 0x1a) {
        uVar4 = 2;
      }
      else {
        if ((uVar6 & 0x200000000) != 0) {
          bVar9 = uVar7 == 0x16;
          if (!bVar9) {
            bVar9 = ((cpu->env).cp15.scr_el3 & 1) == 0;
          }
          if (((uVar4 >> 0x1c & 1) == 0) && (uVar4 = 3, bVar9)) goto LAB_006112bb;
        }
        uVar4 = 1;
      }
    }
    else {
      uVar4 = (cpu->env).pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((cpu->env).v7m.exception == 0) {
      uVar4 = ~(cpu->env).v7m.control[(cpu->env).v7m.secure] & 1;
    }
  }
LAB_006112bb:
  if (uVar4 == 0) {
    lVar5 = (ulong)((~uVar3 & 0x408000000) == 0) * 8 + 0xa848;
  }
  else if (uVar4 != 1) {
    if (uVar4 != 2) {
      return false;
    }
    lVar5 = 0xa850;
    if ((uVar3 & 0x400000000) == 0) {
      return false;
    }
  }
LAB_0061127c:
  if (*(int *)((long)(cpu->parent_obj).jmp_env[0].__jmpbuf + lVar5 + -0x40) !=
      (int)(cpu->env).cp15.dbgbvr[uVar8]) {
    return false;
  }
  return true;
}

Assistant:

static bool bp_wp_matches(ARMCPU *cpu, int n, bool is_wp)
{
    CPUARMState *env = &cpu->env;
    uint64_t cr;
    int pac, hmc, ssc, wt, lbn;
    /*
     * Note that for watchpoints the check is against the CPU security
     * state, not the S/NS attribute on the offending data access.
     */
    bool is_secure = arm_is_secure(env);
    int access_el = arm_current_el(env);

    if (is_wp) {
        CPUWatchpoint *wp = env->cpu_watchpoint[n];

        if (!wp || !(wp->flags & BP_WATCHPOINT_HIT)) {
            return false;
        }
        cr = env->cp15.dbgwcr[n];
        if (wp->hitattrs.user) {
            /*
             * The LDRT/STRT/LDT/STT "unprivileged access" instructions should
             * match watchpoints as if they were accesses done at EL0, even if
             * the CPU is at EL1 or higher.
             */
            access_el = 0;
        }
    } else {
        uint64_t pc = is_a64(env) ? env->pc : env->regs[15];

        if (!env->cpu_breakpoint[n] || env->cpu_breakpoint[n]->pc != pc) {
            return false;
        }
        cr = env->cp15.dbgbcr[n];
    }
    /*
     * The WATCHPOINT_HIT flag guarantees us that the watchpoint is
     * enabled and that the address and access type match; for breakpoints
     * we know the address matched; check the remaining fields, including
     * linked breakpoints. We rely on WCR and BCR having the same layout
     * for the LBN, SSC, HMC, PAC/PMC and is-linked fields.
     * Note that some combinations of {PAC, HMC, SSC} are reserved and
     * must act either like some valid combination or as if the watchpoint
     * were disabled. We choose the former, and use this together with
     * the fact that EL3 must always be Secure and EL2 must always be
     * Non-Secure to simplify the code slightly compared to the full
     * table in the ARM ARM.
     */
    pac = extract64(cr, 1, 2);
    hmc = extract64(cr, 13, 1);
    ssc = extract64(cr, 14, 2);

    switch (ssc) {
    case 0:
        break;
    case 1:
    case 3:
        if (is_secure) {
            return false;
        }
        break;
    case 2:
        if (!is_secure) {
            return false;
        }
        break;
    }

    switch (access_el) {
    case 3:
    case 2:
        if (!hmc) {
            return false;
        }
        break;
    case 1:
        if (extract32(pac, 0, 1) == 0) {
            return false;
        }
        break;
    case 0:
        if (extract32(pac, 1, 1) == 0) {
            return false;
        }
        break;
    default:
        g_assert_not_reached();
    }

    wt = extract64(cr, 20, 1);
    lbn = extract64(cr, 16, 4);

    if (wt && !linked_bp_matches(cpu, lbn)) {
        return false;
    }

    return true;
}